

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock
          (ThreadSafeArena *this,void *buf,size_t size,AllocationPolicy *policy)

{
  ulong uVar1;
  ArenaBlock *pAVar2;
  size_t size_00;
  SizedPtr SVar3;
  
  SVar3.n = size;
  SVar3.p = buf;
  uVar1 = policy->start_block_size;
  if ((((uVar1 == 0x100) && (policy->max_block_size == 0x8000)) &&
      ((AllocationPolicy *)policy->block_alloc == (AllocationPolicy *)0x0)) &&
     (policy->block_dealloc == (_func_void_void_ptr_size_t *)0x0)) {
    pAVar2 = FirstBlock(this,buf,size);
    return pAVar2;
  }
  if (((ulong)buf & 7) == 0) {
    if (size < 0x30 || buf == (void *)0x0) {
      size_00 = 0x30;
      if (0x30 < uVar1) {
        size_00 = uVar1;
      }
      SVar3 = anon_unknown_12::AllocateMemory((AllocationPolicy *)policy->block_alloc,size_00);
    }
    else {
      *(undefined1 *)buf = 0;
      *(undefined1 *)((long)buf + (size - 1)) = 0;
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
    }
    ArenaBlock::ArenaBlock((ArenaBlock *)SVar3.p,(ArenaBlock *)0x0,SVar3.n);
    return (ArenaBlock *)SVar3.p;
  }
  FirstBlock();
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size,
                                        const AllocationPolicy& policy) {
  if (policy.IsDefault()) return FirstBlock(buf, size);

  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);

  SizedPtr mem;
  if (buf == nullptr || size < kBlockHeaderSize + kAllocPolicySize) {
    mem = AllocateBlock(&policy, 0, kAllocPolicySize);
  } else {
    mem = {buf, size};
    // Record user-owned block.
    if constexpr (internal::PerformDebugChecks()) {
      // Touch block to verify it is addressable.
      if (size > 0) {
        static_cast<char*>(buf)[0] = 0;
        static_cast<char*>(buf)[size - 1] = 0;
      }
    }
    ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(buf, size);
    alloc_policy_.set_is_user_owned_initial_block(true);
  }

  return new (mem.p) ArenaBlock{nullptr, mem.n};
}